

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aGen.hpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> *
ag::BitConverter::GetFloat
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,float u)

{
  value_type vVar1;
  reference pvVar2;
  ulong local_40;
  size_t i;
  allocator<unsigned_char> local_22;
  undefined1 local_21;
  long local_20;
  uint8_t *p;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvStack_10;
  float u_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *ret;
  
  local_20 = (long)&p + 4;
  local_21 = 0;
  p._4_4_ = u;
  pvStack_10 = __return_storage_ptr__;
  std::allocator<unsigned_char>::allocator(&local_22);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,4,&local_22);
  std::allocator<unsigned_char>::~allocator(&local_22);
  for (local_40 = 0; local_40 < 4; local_40 = local_40 + 1) {
    vVar1 = *(value_type *)(local_20 + local_40);
    pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (__return_storage_ptr__,local_40);
    *pvVar2 = vVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<uint8_t> GetFloat(float u)
		{
			uint8_t const * p = reinterpret_cast<uint8_t const*>(&u);

			std::vector<uint8_t> ret(sizeof(float));
			for (size_t i = 0; i < sizeof(float); i++)
				ret[i] = p[i];

			return ret;
		}